

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

int If_ManSatDeriveGiaFromBits
              (void *pGia,Ifn_Ntk_t *p,word *pConfigData,Vec_Int_t *vLeaves,Vec_Int_t *vCover)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  word t;
  word *pwVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  word uTruth;
  word local_1040;
  ulong local_1038;
  Vec_Int_t *local_1030;
  Vec_Int_t Leaves;
  int pFaninLits [16];
  int pVarMap [1000];
  
  iVar14 = p->nParsVIni;
  iVar1 = iVar14 - p->nObjs;
  iVar7 = p->nInps;
  local_1030 = vCover;
  iVar2 = Abc_Base2Log(iVar7 + 1);
  if ((iVar7 < vLeaves->nSize) || (999 < iVar14)) {
    __assert_fail("Vec_IntSize(vLeaves) <= p->nInps && p->nParsVIni < 1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x2ed,
                  "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  uVar3 = (iVar2 + 1) * iVar7 + iVar1;
  local_1038 = (ulong)uVar3;
  local_1040 = pConfigData[(int)uVar3 >> 6];
  lVar4 = 0;
  iVar14 = iVar1;
  while( true ) {
    lVar10 = (long)iVar7;
    if (lVar10 <= lVar4) break;
    uVar3 = 0;
    for (iVar7 = 0; iVar7 <= iVar2; iVar7 = iVar7 + 1) {
      uVar12 = 1 << ((byte)iVar7 & 0x1f);
      if ((pConfigData[iVar14 + iVar7 >> 6] >> ((ulong)(uint)(iVar14 + iVar7) & 0x3f) & 1) == 0) {
        uVar12 = 0;
      }
      uVar3 = uVar3 | uVar12;
    }
    iVar7 = Abc_Lit2Var(uVar3);
    if (vLeaves->nSize <= iVar7) {
      __assert_fail("Abc_Lit2Var(iLit) < Vec_IntSize(vLeaves)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                    ,0x2f3,
                    "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if ((int)uVar3 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x135,"int Abc_Lit2LitL(int *, int)");
    }
    piVar9 = vLeaves->pArray;
    uVar12 = Abc_Lit2Var(uVar3);
    iVar7 = Abc_LitNotCond(piVar9[uVar12],uVar3 & 1);
    pVarMap[lVar4] = iVar7;
    lVar4 = lVar4 + 1;
    iVar7 = p->nInps;
    iVar14 = iVar14 + iVar2 + 1;
  }
  piVar9 = p->Nodes[lVar10].Fanins;
  uVar11 = 0;
  while( true ) {
    if (p->nObjs <= lVar10) {
      if ((int)uVar11 == iVar1) {
        iVar14 = Abc_LitNotCond(pFaninLits[(long)p->nObjs + 0xf],
                                (uint)((local_1040 >> (local_1038 & 0x3f) & 1) != 0));
        return iVar14;
      }
      __assert_fail("iVar == nTtBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                    ,0x32a,
                    "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    uVar3 = *(uint *)(p->Nodes + lVar10) >> 3 & 0x1f;
    if (6 < uVar3) break;
    uVar12 = *(uint *)(p->Nodes + lVar10) & 7;
    if (3 < uVar12 - 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                    ,0x328,
                    "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    uVar16 = (ulong)uVar3;
    switch(uVar12) {
    case 3:
      iVar14 = 1;
      for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
        iVar14 = Gia_ManHashAnd((Gia_Man_t *)pGia,iVar14,pVarMap[piVar9[uVar15]]);
      }
      pVarMap[lVar10] = iVar14;
      break;
    case 4:
      iVar14 = 0;
      for (uVar16 = 0; uVar3 != uVar16; uVar16 = uVar16 + 1) {
        iVar14 = Gia_ManHashXor((Gia_Man_t *)pGia,iVar14,pVarMap[piVar9[uVar16]]);
      }
      pVarMap[lVar10] = iVar14;
      break;
    case 5:
      if (uVar3 != 3) {
        __assert_fail("nFans == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x30d,
                      "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar14 = Gia_ManHashMux((Gia_Man_t *)pGia,pVarMap[p->Nodes[lVar10].Fanins[0]],
                              pVarMap[p->Nodes[lVar10].Fanins[1]],
                              pVarMap[p->Nodes[lVar10].Fanins[2]]);
      pVarMap[lVar10] = iVar14;
      break;
    case 6:
      uTruth = 0;
      t = 0;
      for (uVar15 = 0; (uint)uVar15 >> (sbyte)uVar3 == 0; uVar15 = uVar15 + 1) {
        uVar5 = (uVar11 & 0xffffffff) + uVar15;
        if ((pConfigData[(int)uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0) {
          t = t | 1L << (uVar15 & 0x3f);
          uTruth = t;
        }
      }
      uVar5 = Abc_Tt6Stretch(t,uVar3);
      uVar11 = (uVar11 & 0xffffffff) + uVar15;
      for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
        pFaninLits[uVar15] = pVarMap[piVar9[uVar15]];
      }
      pwVar13 = s_Truths6Neg;
      lVar4 = 0x7db748;
      uVar12 = 0;
      uTruth = uVar5;
      for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
        bVar6 = (byte)(1 << ((byte)uVar15 & 0x1f));
        if ((*pwVar13 & (uVar5 >> (bVar6 & 0x3f) ^ uVar5)) != 0) {
          lVar8 = (long)(int)uVar12;
          if ((lVar8 < (long)uVar15) && (pFaninLits[lVar8] = pFaninLits[uVar15], uVar15 != uVar12))
          {
            bVar6 = bVar6 + (char)(-1 << ((byte)uVar12 & 0x1f));
            lVar8 = lVar8 * 0x90;
            uVar5 = (uVar5 & *(ulong *)(lVar4 + 8 + lVar8)) >> (bVar6 & 0x3f) |
                    (*(ulong *)(lVar4 + lVar8) & uVar5) << (bVar6 & 0x3f) |
                    *(ulong *)(lVar4 + -8 + lVar8) & uVar5;
            uTruth = uVar5;
          }
          uVar12 = uVar12 + 1;
        }
        lVar4 = lVar4 + 0x18;
        pwVar13 = pwVar13 + 1;
      }
      if ((int)uVar3 < (int)uVar12) {
        __assert_fail("k < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
      }
      if (uVar12 == 0) {
        uVar3 = (uint)uVar5 & 1;
      }
      else {
        Leaves.pArray = pFaninLits;
        Leaves.nCap = uVar12;
        Leaves.nSize = uVar12;
        uVar3 = Kit_TruthToGia((Gia_Man_t *)pGia,(uint *)&uTruth,uVar12,local_1030,&Leaves,1);
      }
      pVarMap[lVar10] = uVar3;
    }
    lVar10 = lVar10 + 1;
    piVar9 = piVar9 + 0xc;
  }
  __assert_fail("nFans <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                ,0x2fc,
                "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

int If_ManSatDeriveGiaFromBits( void * pGia, Ifn_Ntk_t * p, word * pConfigData, Vec_Int_t * vLeaves, Vec_Int_t * vCover )
{
    Gia_Man_t * pNew = (Gia_Man_t *)pGia;
    int i, k, iLit, iVar = 0, nVarsNew, pVarMap[1000];
    int nTtBits = p->nParsVIni - p->nObjs;
    int nPermBits = Abc_Base2Log(p->nInps + 1) + 1;
    int fCompl = Abc_TtGetBit( pConfigData, nTtBits + nPermBits * p->nInps );
    assert( Vec_IntSize(vLeaves) <= p->nInps && p->nParsVIni < 1000 );
    for ( i = 0; i < p->nInps; i++ )
    {
        for ( iLit = k = 0; k < nPermBits; k++ )
            if ( Abc_TtGetBit(pConfigData, nTtBits + i * nPermBits + k) )
                iLit |= (1 << k);
        assert( Abc_Lit2Var(iLit) < Vec_IntSize(vLeaves) );
        pVarMap[i] = Abc_Lit2LitL( Vec_IntArray(vLeaves), iLit );
    }
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int Type = p->Nodes[i].Type;
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        //int iFanin = p->Nodes[i].iFirst;
        assert( nFans <= 6 );
        if ( Type == IFN_DSD_AND )
        {
            iLit = 1;
            for ( k = 0; k < nFans; k++ )
                iLit = Gia_ManHashAnd( pNew, iLit, pVarMap[pFans[k]] );
            pVarMap[i] = iLit;
        }
        else if ( Type == IFN_DSD_XOR )
        {
            iLit = 0;
            for ( k = 0; k < nFans; k++ )
                iLit = Gia_ManHashXor( pNew, iLit, pVarMap[pFans[k]] );
            pVarMap[i] = iLit;
        }
        else if ( Type == IFN_DSD_MUX )
        {
            assert( nFans == 3 );
            pVarMap[i] = Gia_ManHashMux( pNew, pVarMap[pFans[0]], pVarMap[pFans[1]], pVarMap[pFans[2]] );
        }
        else if ( Type == IFN_DSD_PRIME )
        {
            int pFaninLits[16];
            // collect truth table
            word uTruth = 0;
            int nMints = (1 << nFans);
            for ( k = 0; k < nMints; k++ )
                if ( Abc_TtGetBit(pConfigData, iVar++) )
                    uTruth |= ((word)1 << k);
            uTruth = Abc_Tt6Stretch( uTruth, nFans );
            // collect function
            for ( k = 0; k < nFans; k++ )
                pFaninLits[k] = pVarMap[pFans[k]];
            // implement the function
            nVarsNew = Abc_TtMinBase( &uTruth, pFaninLits, nFans, 6 );
            if ( nVarsNew == 0 )
                pVarMap[i] = (int)(uTruth & 1);
            else
            {
                extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
                Vec_Int_t Leaves = { nVarsNew, nVarsNew, pFaninLits };
                pVarMap[i] = Kit_TruthToGia( pNew, (unsigned *)&uTruth, nVarsNew, vCover, &Leaves, 1 ); // hashing enabled!!!
            }
        }
        else assert( 0 );
    }
    assert( iVar == nTtBits );
    return Abc_LitNotCond( pVarMap[p->nObjs - 1], fCompl );
}